

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SenderFlow.cpp
# Opt level: O1

void __thiscall SenderFlow::~SenderFlow(SenderFlow *this)

{
  void *pvVar1;
  pointer pcVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char buffer [3];
  char local_1c [4];
  
  local_1c[2] = 0;
  local_1c[0] = '#';
  local_1c[1] = '\\';
  pvVar1 = this->m_notif_socket;
  sVar3 = strlen(local_1c);
  zmq_send(pvVar1,local_1c,sVar3,0);
  zmq_close(this->m_stream_socket);
  zmq_close(this->m_notif_socket);
  zmq_ctx_term(this->m_context);
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  paVar4 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar4) {
    operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SenderFlow::~SenderFlow()
{
    // Send graceful end of transmission notification
    end_transmission();
    // safely close all ZMQ entities.
    zmq_close(m_stream_socket);
    zmq_close(m_notif_socket);
    zmq_ctx_term(m_context);
}